

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int compare(void *ind1,void *ind2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (**ind1 <= **ind2) {
    uVar1 = (uint)(**ind1 < **ind2);
  }
  return uVar1;
}

Assistant:

int compare (const void* ind1, const void* ind2)
{
	if (*((vipair *)ind1)->a > *((vipair *)ind2)->a)
		return -1;
	else if (*((vipair *)ind1)->a < *((vipair *)ind2)->a)
		return 1;
	else
		return 0;
}